

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setHost(QUrl *this,QString *host,ParsingMode mode)

{
  Data *pDVar1;
  QChar c;
  QLatin1StringView after;
  bool bVar2;
  pointer pEVar3;
  int in_EDX;
  qsizetype in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  qsizetype in_stack_00000008;
  QString *in_stack_00000010;
  QUrlPrivate *in_stack_00000018;
  QString data;
  undefined4 in_stack_ffffffffffffff48;
  CaseSensitivity in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  CaseSensitivity in_stack_ffffffffffffff54;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  QString *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  QChar QVar4;
  CaseSensitivity in_stack_ffffffffffffff8c;
  QString *pQVar5;
  QChar in_stack_ffffffffffffffd6;
  QChar local_28;
  QChar local_26;
  QChar local_24;
  QChar local_22;
  QString local_20;
  long lVar6;
  
  QVar4.ucs = (char16_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  detach((QUrl *)in_stack_ffffffffffffff60);
  QUrlPrivate::clearError((QUrlPrivate *)0x2fbd0c);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (in_EDX == 2) {
    QChar::QChar<char16_t,_true>(&local_22,L'%');
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT17(in_stack_ffffffffffffff5f,
                                CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    after.m_data = (char *)pQVar5;
    after.m_size = in_RSI;
    QString::replace(in_RDI,in_stack_ffffffffffffffd6,after,in_stack_ffffffffffffff8c);
  }
  QString::size(&local_20);
  bVar2 = QUrlPrivate::setHost
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (ParsingMode)((ulong)lVar6 >> 0x20));
  if (!bVar2) {
    QChar::QChar<char16_t,_true>(&local_24,L'[');
    bVar2 = QString::startsWith((QString *)
                                CONCAT17(in_stack_ffffffffffffff5f,
                                         CONCAT16(in_stack_ffffffffffffff5e,
                                                  in_stack_ffffffffffffff58)),QVar4,
                                in_stack_ffffffffffffff54);
    if (!bVar2) {
      QChar::QChar<char16_t,_true>(&local_26,L'[');
      c.ucs._1_1_ = in_stack_ffffffffffffff5f;
      c.ucs._0_1_ = in_stack_ffffffffffffff5e;
      QString::prepend((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),c);
      QChar::QChar<char16_t,_true>(&local_28,L']');
      QString::append(in_stack_ffffffffffffff60,QVar4);
      QString::size(&local_20);
      bVar2 = QUrlPrivate::setHost
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                         (ParsingMode)((ulong)lVar6 >> 0x20));
      if (bVar2) {
        QUrlPrivate::clearError((QUrlPrivate *)0x2fbf89);
      }
      else {
        QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffd6,L':');
        QVar4.ucs._1_1_ = in_stack_ffffffffffffff5f;
        QVar4.ucs._0_1_ = in_stack_ffffffffffffff5e;
        bVar2 = QString::contains((QString *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  QVar4,in_stack_ffffffffffffff4c);
        if (bVar2) {
          pEVar3 = std::unique_ptr<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>::
                   operator->((unique_ptr<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>
                               *)0x2fbf5b);
          pEVar3->code = InvalidIPv6AddressError;
        }
        pDVar1 = (in_RDI->d).d;
        *(byte *)&pDVar1[0xb].super_QArrayData.alloc =
             (byte)pDVar1[0xb].super_QArrayData.alloc & 0xf7;
      }
    }
  }
  QString::~QString((QString *)0x2fbfa6);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrl::setHost(const QString &host, ParsingMode mode)
{
    detach();
    d->clearError();

    QString data = host;
    if (mode == DecodedMode) {
        data.replace(u'%', "%25"_L1);
        mode = TolerantMode;
    }

    if (d->setHost(data, 0, data.size(), mode)) {
        return;
    } else if (!data.startsWith(u'[')) {
        // setHost failed, it might be IPv6 or IPvFuture in need of bracketing
        Q_ASSERT(d->error);

        data.prepend(u'[');
        data.append(u']');
        if (!d->setHost(data, 0, data.size(), mode)) {
            // failed again
            if (data.contains(u':')) {
                // source data contains ':', so it's an IPv6 error
                d->error->code = QUrlPrivate::InvalidIPv6AddressError;
            }
            d->sectionIsPresent &= ~QUrlPrivate::Host;
        } else {
            // succeeded
            d->clearError();
        }
    }
}